

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk40(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk40_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk40.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk40.version);
    if ((bios->power).unk40.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk40.offset + 1,&(bios->power).unk40.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk40.offset + 2,&(bios->power).unk40.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk40.offset + 3,&(bios->power).unk40.entriesnum);
      (bios->power).unk40.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk40.entriesnum;
      peVar5 = (envy_bios_power_unk40_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk40.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk40.rlen * (int)uVar6 +
             (uint)(bios->power).unk40.hlen + (bios->power).unk40.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown POWER LEAKAGE table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk40(struct envy_bios *bios) {
	struct envy_bios_power_unk40 *unk40 = &bios->power.unk40;
	int i, err = 0;

	if (!unk40->offset)
		return -EINVAL;

	bios_u8(bios, unk40->offset + 0x0, &unk40->version);
	switch(unk40->version) {
	case 0x10:
		err |= bios_u8(bios, unk40->offset + 0x1, &unk40->hlen);
		err |= bios_u8(bios, unk40->offset + 0x2, &unk40->rlen);
		err |= bios_u8(bios, unk40->offset + 0x3, &unk40->entriesnum);
		unk40->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER LEAKAGE table version 0x%x\n", unk40->version);
		return -EINVAL;
	};

	err = 0;
	unk40->entries = malloc(unk40->entriesnum * sizeof(struct envy_bios_power_unk40_entry));
	for (i = 0; i < unk40->entriesnum; i++) {
		uint32_t data = unk40->offset + unk40->hlen + i * unk40->rlen;

		unk40->entries[i].offset = data;
	}

	return 0;
}